

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  uint uVar1;
  uchar *puVar2;
  stbtt_packedchar *psVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [14];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  unkbyte10 Var18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint6 uVar22;
  undefined8 uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  stbtt_pack_range *psVar29;
  stbrp_coord *psVar30;
  long lVar31;
  ulong uVar32;
  ushort uVar33;
  char cVar36;
  char cVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  short sVar41;
  short sVar42;
  ushort uVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  int y0;
  int x0;
  int advance;
  int y1;
  int x1;
  int lsb;
  int local_c4;
  int local_c0;
  int local_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  stbtt_pack_range *local_a8;
  stbrp_coord *local_a0;
  ulong local_98;
  ulong local_90;
  stbtt_pack_range *local_88;
  stbtt_packedchar *local_80;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  local_68._0_4_ = spc->h_oversample;
  local_68._4_4_ = spc->v_oversample;
  uStack_60 = 0;
  if (num_ranges < 1) {
    iVar25 = 1;
  }
  else {
    local_98 = (ulong)(uint)num_ranges;
    psVar30 = &rects->w;
    iVar25 = 1;
    uVar32 = 0xffffffff;
    local_90 = 0;
    iVar26 = 0;
    local_a8 = ranges;
    local_a0 = psVar30;
    do {
      local_b8 = ranges[local_90].font_size;
      uStack_b4 = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
      if (local_b8 <= 0.0) {
        uStack_b4 = 0x80000000;
        uStack_b0 = 0x80000000;
        uStack_ac = 0x80000000;
        local_b8 = -local_b8;
        uVar28 = (uint)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                               *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
      }
      else {
        puVar2 = info->data;
        lVar31 = (long)info->hhea;
        uVar28 = ((int)(short)((ushort)puVar2[lVar31 + 4] << 8) | (uint)puVar2[lVar31 + 5]) -
                 ((int)(short)((ushort)puVar2[lVar31 + 6] << 8) | (uint)puVar2[lVar31 + 7]);
      }
      local_b8 = local_b8 / (float)(int)uVar28;
      psVar29 = ranges + local_90;
      uVar27._0_1_ = psVar29->h_oversample;
      uVar27._1_1_ = psVar29->v_oversample;
      uVar27._2_6_ = *(undefined6 *)&psVar29->field_0x22;
      auVar4._8_6_ = 0;
      auVar4._0_8_ = uVar27;
      auVar4[0xe] = (char)((uint6)uVar27._2_6_ >> 0x28);
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar27;
      auVar6[0xc] = (char)((uint6)uVar27._2_6_ >> 0x20);
      auVar6._13_2_ = auVar4._13_2_;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar27;
      auVar7._12_3_ = auVar6._12_3_;
      auVar8._8_2_ = 0;
      auVar8._0_8_ = uVar27;
      auVar8[10] = (char)((uint6)uVar27._2_6_ >> 0x18);
      auVar8._11_4_ = auVar7._11_4_;
      auVar9._8_2_ = 0;
      auVar9._0_8_ = uVar27;
      auVar9._10_5_ = auVar8._10_5_;
      auVar11[8] = (char)((uint6)uVar27._2_6_ >> 0x10);
      auVar11._0_8_ = uVar27;
      auVar11._9_6_ = auVar9._9_6_;
      auVar13._7_8_ = 0;
      auVar13._0_7_ = auVar11._8_7_;
      cVar37 = (char)((uint6)uVar27._2_6_ >> 8);
      Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),cVar37);
      auVar20._9_6_ = 0;
      auVar20._0_9_ = Var14;
      cVar36 = (char)uVar27._2_6_;
      auVar15._1_10_ = SUB1510(auVar20 << 0x30,5);
      auVar15[0] = cVar36;
      auVar21._11_4_ = 0;
      auVar21._0_11_ = auVar15;
      auVar16._1_12_ = SUB1512(auVar21 << 0x20,3);
      auVar16[0] = uVar27._1_1_;
      uVar33 = CONCAT11(0,(undefined1)uVar27);
      auVar12._2_13_ = auVar16;
      auVar12._0_2_ = uVar33;
      uVar43 = (ushort)Var14;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar12._0_10_;
      auVar5._12_2_ = uVar43;
      sVar42 = auVar15._0_2_;
      uVar22 = CONCAT42(auVar5._10_4_,sVar42);
      auVar17._6_8_ = 0;
      auVar17._0_6_ = uVar22;
      sVar41 = auVar16._0_2_;
      Var18 = CONCAT82(SUB148(auVar17 << 0x40,6),sVar41);
      auVar10._4_10_ = Var18;
      auVar10._0_4_ = CONCAT22(0,uVar33);
      spc->h_oversample = (int)auVar10._0_8_;
      spc->v_oversample = (int)((ulong)auVar10._0_8_ >> 0x20);
      if (0 < psVar29->num_chars) {
        auVar38._0_4_ = (float)CONCAT22(0,uVar33);
        auVar38._4_4_ = (float)(int)Var18;
        auVar38._8_4_ = (float)(int)uVar22;
        auVar38._12_4_ = (float)uVar43;
        local_58 = divps(_DAT_0015b250,auVar38);
        auVar44[0] = -((undefined1)uVar27 == 0);
        auVar44[1] = -((undefined1)uVar27 == 0);
        auVar44[2] = -((undefined1)uVar27 == 0);
        auVar44[3] = -((undefined1)uVar27 == 0);
        auVar44[4] = -(uVar27._1_1_ == '\0');
        auVar44[5] = -(uVar27._1_1_ == '\0');
        auVar44[6] = -(uVar27._1_1_ == '\0');
        auVar44[7] = -(uVar27._1_1_ == '\0');
        auVar44[8] = -(cVar36 == '\0');
        auVar44[9] = -(cVar36 == '\0');
        auVar44[10] = -(cVar36 == '\0');
        auVar44[0xb] = -(cVar36 == '\0');
        auVar44[0xc] = -(cVar37 == '\0');
        auVar44[0xd] = -(cVar37 == '\0');
        auVar44[0xe] = -(cVar37 == '\0');
        auVar44[0xf] = -(cVar37 == '\0');
        auVar34._12_2_ = uVar43;
        auVar34._0_12_ = auVar12._0_12_;
        auVar34._14_2_ = -uVar43;
        auVar40._12_4_ = auVar34._12_4_;
        auVar40._10_2_ = -sVar42;
        auVar40._0_10_ = auVar12._0_10_;
        uVar23 = CONCAT62(auVar40._10_6_,sVar42);
        auVar19._4_8_ = uVar23;
        auVar19._2_2_ = 1 - sVar41;
        auVar19._0_2_ = sVar41;
        auVar35._0_4_ = (float)(int)(short)(1 - uVar33);
        auVar35._4_4_ = (float)(auVar19._0_4_ >> 0x10);
        auVar35._8_4_ = (float)((int)uVar23 >> 0x10);
        auVar35._12_4_ = (float)(auVar40._12_4_ >> 0x10);
        auVar39._0_4_ = auVar38._0_4_ + auVar38._0_4_;
        auVar39._4_4_ = auVar38._4_4_ + auVar38._4_4_;
        auVar39._8_4_ = auVar38._8_4_ + auVar38._8_4_;
        auVar39._12_4_ = auVar38._12_4_ + auVar38._12_4_;
        local_48._0_16_ = divps(auVar35,auVar39);
        local_48._0_16_ = ~auVar44 & local_48._0_16_;
        psVar30 = psVar30 + (long)iVar26 * 8;
        lVar31 = 0;
        uVar27 = 0;
        local_88 = psVar29;
        do {
          if (*(uint *)(psVar30 + 4) == 0) {
LAB_00111cc7:
            iVar25 = 0;
          }
          else {
            uVar33 = *psVar30;
            if (uVar33 == 0) {
              if (((spc->skip_missing != 0) || (psVar30[1] != 0)) || ((int)uVar32 < 0))
              goto LAB_00111cc7;
              psVar3 = psVar29->chardata_for_range;
              auVar40 = *(undefined1 (*) [16])(psVar3 + uVar32);
              *(undefined1 (*) [16])((long)&psVar3->yoff + lVar31) =
                   *(undefined1 (*) [16])&psVar3[uVar32].yoff;
              *(undefined1 (*) [16])((long)&psVar3->x0 + lVar31) = auVar40;
            }
            else {
              uVar43 = psVar30[1];
              if (uVar43 == 0) {
                iVar25 = 0;
              }
              else {
                if (psVar29->array_of_unicode_codepoints == (int *)0x0) {
                  iVar24 = psVar29->first_unicode_codepoint_in_range + (int)uVar27;
                }
                else {
                  iVar24 = psVar29->array_of_unicode_codepoints[uVar27];
                }
                local_80 = psVar29->chardata_for_range;
                iVar24 = stbtt_FindGlyphIndex(info,iVar24);
                uVar28 = spc->padding;
                auVar40 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
                *(uint *)(psVar30 + 2) =
                     CONCAT22(auVar40._2_2_ + (short)(*(uint *)(psVar30 + 2) >> 0x10),
                              auVar40._0_2_ + (short)*(uint *)(psVar30 + 2));
                *psVar30 = uVar33 - (short)uVar28;
                psVar30[1] = uVar43 - (short)uVar28;
                stbtt_GetGlyphHMetrics(info,iVar24,&local_bc,&local_6c);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (info,iVar24,(float)spc->h_oversample * local_b8,
                           (float)spc->v_oversample * local_b8,0.0,0.0,&local_c0,&local_c4,&local_70
                           ,&local_74);
                stbtt_MakeGlyphBitmapSubpixel
                          (info,spc->pixels +
                                (ulong)psVar30[3] * (long)spc->stride_in_bytes + (ulong)psVar30[2],
                           ((uint)*psVar30 - spc->h_oversample) + 1,
                           ((uint)psVar30[1] - spc->v_oversample) + 1,spc->stride_in_bytes,
                           (float)spc->h_oversample * local_b8,(float)spc->v_oversample * local_b8,
                           0.0,0.0,iVar24);
                if (1 < spc->h_oversample) {
                  stbtt__h_prefilter(spc->pixels +
                                     (ulong)psVar30[3] * (long)spc->stride_in_bytes +
                                     (ulong)psVar30[2],(uint)*psVar30,(uint)psVar30[1],
                                     spc->stride_in_bytes,spc->h_oversample);
                }
                if (1 < spc->v_oversample) {
                  stbtt__v_prefilter(spc->pixels +
                                     (ulong)psVar30[3] * (long)spc->stride_in_bytes +
                                     (ulong)psVar30[2],(uint)*psVar30,(uint)psVar30[1],
                                     spc->stride_in_bytes,spc->v_oversample);
                }
                *(float *)((long)&local_80->xadvance + lVar31) = (float)local_bc * local_b8;
                *(ulong *)((long)&local_80->xoff + lVar31) =
                     CONCAT44((float)local_c4 * local_58._4_4_ + (float)local_48._4_4_,
                              (float)local_c0 * local_58._0_4_ + (float)local_48._0_4_);
                uVar28 = *(uint *)(psVar30 + 2);
                *(uint *)((long)&local_80->x0 + lVar31) = uVar28;
                uVar1 = *(uint *)psVar30;
                uVar33 = (ushort)(uVar1 >> 0x10);
                *(uint *)((long)&local_80->x1 + lVar31) =
                     CONCAT22((short)(uVar28 >> 0x10) + uVar33,(short)uVar28 + (short)uVar1);
                *(ulong *)((long)&local_80->xoff2 + lVar31) =
                     CONCAT44((float)(int)((uint)uVar33 + local_c4) * local_58._4_4_ +
                              (float)local_48._4_4_,
                              (float)(int)((uVar1 & 0xffff) + local_c0) * local_58._0_4_ +
                              (float)local_48._0_4_);
                psVar29 = local_88;
                if (iVar24 == 0) {
                  uVar32 = uVar27 & 0xffffffff;
                }
              }
            }
          }
          uVar27 = uVar27 + 1;
          psVar30 = psVar30 + 8;
          lVar31 = lVar31 + 0x1c;
        } while ((long)uVar27 < (long)psVar29->num_chars);
        iVar26 = iVar26 + (int)uVar27;
        ranges = local_a8;
        psVar30 = local_a0;
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_98);
  }
  spc->h_oversample = (undefined4)local_68;
  spc->v_oversample = local_68._4_4_;
  return iVar25;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
int i,j,k, missing_glyph = -1, return_value = 1;

/*  save current values */
int old_h_over = spc->h_oversample;
int old_v_over = spc->v_oversample;

k = 0;
for (i=0; i < num_ranges; ++i) {
float fh = ranges[i].font_size;
float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
float recip_h,recip_v,sub_x,sub_y;
spc->h_oversample = ranges[i].h_oversample;
spc->v_oversample = ranges[i].v_oversample;
recip_h = 1.0f / spc->h_oversample;
recip_v = 1.0f / spc->v_oversample;
sub_x = stbtt__oversample_shift(spc->h_oversample);
sub_y = stbtt__oversample_shift(spc->v_oversample);
for (j=0; j < ranges[i].num_chars; ++j) {
stbrp_rect *r = &rects[k];
if (r->was_packed && r->w != 0 && r->h != 0) {
stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
int advance, lsb, x0,y0,x1,y1;
int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
int glyph = stbtt_FindGlyphIndex(info, codepoint);
stbrp_coord pad = (stbrp_coord) spc->padding;

/*  pad on left and top */
r->x += pad;
r->y += pad;
r->w -= pad;
r->h -= pad;
stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
stbtt_GetGlyphBitmapBox(info, glyph,
scale * spc->h_oversample,
scale * spc->v_oversample,
&x0,&y0,&x1,&y1);
stbtt_MakeGlyphBitmapSubpixel(info,
spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w - spc->h_oversample+1,
r->h - spc->v_oversample+1,
spc->stride_in_bytes,
scale * spc->h_oversample,
scale * spc->v_oversample,
0,0,
glyph);

if (spc->h_oversample > 1)
stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->h_oversample);

if (spc->v_oversample > 1)
stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->v_oversample);

bc->x0       = (stbtt_int16)  r->x;
bc->y0       = (stbtt_int16)  r->y;
bc->x1       = (stbtt_int16) (r->x + r->w);
bc->y1       = (stbtt_int16) (r->y + r->h);
bc->xadvance =                scale * advance;
bc->xoff     =       (float)  x0 * recip_h + sub_x;
bc->yoff     =       (float)  y0 * recip_v + sub_y;
bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;

if (glyph == 0)
missing_glyph = j;
} else if (spc->skip_missing) {
return_value = 0;
} else if (r->was_packed && r->w == 0 && r->h == 0 && missing_glyph >= 0) {
ranges[i].chardata_for_range[j] = ranges[i].chardata_for_range[missing_glyph];
} else {
return_value = 0; /*  if any fail, report failure */
}

++k;
}
}

/*  restore original values */
spc->h_oversample = old_h_over;
spc->v_oversample = old_v_over;

return return_value;
}